

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  uint uVar5;
  parasail_result_t *ppVar6;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  __m128i *palVar16;
  char *__format;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong size;
  int iVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  __m128i alVar23;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  undefined1 auVar24 [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int32_t iVar33;
  int iVar34;
  uint uVar35;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar11 = "profile";
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar11 = "profile->profile32.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar11 = "profile->matrix";
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar11 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar11 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar11 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar11 = "open";
        }
        else {
          if (-1 < gap) {
            uVar13 = uVar8 - 1;
            size = (ulong)uVar8 + 3 >> 2;
            iVar20 = -open;
            iVar18 = ppVar4->min;
            uVar8 = 0x80000000 - iVar18;
            if (iVar18 != iVar20 && SBORROW4(iVar18,iVar20) == iVar18 + open < 0) {
              uVar8 = open | 0x80000000;
            }
            uVar5 = 0x7ffffffe - ppVar4->max;
            ppVar6 = parasail_result_new();
            if (ppVar6 != (parasail_result_t *)0x0) {
              ppVar6->flag = ppVar6->flag | 0x4400401;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar7 = s2Len + -1;
                uVar8 = uVar8 + 1;
                iVar14 = (int)size;
                iVar9 = -(iVar14 * gap);
                iVar18 = iVar20;
                for (uVar17 = 0; uVar17 != size; uVar17 = uVar17 + 1) {
                  iVar12 = iVar18;
                  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
                    lVar19 = (long)iVar12 - (ulong)(uint)open;
                    if (lVar19 < -0x7fffffff) {
                      lVar19 = -0x80000000;
                    }
                    *(int *)((long)&h + lVar10 * 4) = iVar12;
                    *(int *)((long)&e + lVar10 * 4) = (int)lVar19;
                    iVar12 = iVar12 - iVar14 * gap;
                  }
                  ptr_02[uVar17][0] = h.m[0];
                  ptr_02[uVar17][1] = h.m[1];
                  ptr[uVar17][0] = e.m[0];
                  ptr[uVar17][1] = e.m[1];
                  iVar18 = iVar18 - gap;
                }
                *ptr_00 = 0;
                for (uVar17 = 1; s2Len + 1 != uVar17; uVar17 = uVar17 + 1) {
                  ptr_00[uVar17] = iVar20;
                  iVar20 = iVar20 - gap;
                }
                iVar18 = -open;
                iVar20 = -open;
                iVar12 = -open;
                iVar27 = -open;
                for (uVar15 = iVar14 - 1U; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
                  palVar16 = ptr_03 + uVar15;
                  *(int *)*palVar16 = iVar18;
                  *(int *)((long)*palVar16 + 4) = iVar20;
                  *(int *)(*palVar16 + 1) = iVar12;
                  *(int *)((long)*palVar16 + 0xc) = iVar27;
                  iVar18 = iVar18 - gap;
                  iVar20 = iVar20 - gap;
                  iVar12 = iVar12 - gap;
                  iVar27 = iVar27 - gap;
                }
                palVar16 = ptr_02 + (iVar14 - 1U);
                uVar17 = 0;
                uVar15 = uVar8;
                uVar25 = uVar8;
                uVar26 = uVar8;
                uVar28 = uVar8;
                uVar29 = uVar5;
                uVar30 = uVar5;
                uVar31 = uVar5;
                uVar32 = uVar5;
                while (uVar17 != (uint)s2Len) {
                  iVar18 = ppVar4->mapper[(byte)s2[uVar17]];
                  uVar41 = uVar8 - (int)(*ptr_03)[0];
                  uVar43 = uVar8 - *(int *)((long)*ptr_03 + 4);
                  uVar46 = uVar8 - (int)(*ptr_03)[1];
                  uVar49 = uVar8 - *(int *)((long)*ptr_03 + 0xc);
                  iVar33 = ptr_00[uVar17];
                  iVar20 = (int)(*palVar16)[0];
                  iVar12 = *(int *)((long)*palVar16 + 4);
                  iVar27 = (int)(*palVar16)[1];
                  uVar35 = uVar8;
                  uVar38 = uVar8;
                  uVar39 = uVar8;
                  uVar40 = uVar8;
                  for (lVar10 = 0; size << 4 != lVar10; lVar10 = lVar10 + 0x10) {
                    piVar1 = (int *)((long)*ptr_02 + lVar10);
                    iVar51 = *piVar1;
                    iVar45 = piVar1[1];
                    iVar48 = piVar1[2];
                    iVar52 = piVar1[3];
                    piVar1 = (int *)((long)*ptr + lVar10);
                    iVar53 = *piVar1 - gap;
                    iVar54 = piVar1[1] - gap;
                    iVar55 = piVar1[2] - gap;
                    iVar56 = piVar1[3] - gap;
                    iVar57 = iVar51 - open;
                    iVar59 = iVar45 - open;
                    iVar61 = iVar48 - open;
                    iVar63 = iVar52 - open;
                    piVar1 = (int *)((long)pvVar3 + lVar10 + (long)(iVar18 * iVar14) * 0x10);
                    iVar34 = iVar33 + *piVar1;
                    iVar20 = iVar20 + piVar1[1];
                    iVar12 = iVar12 + piVar1[2];
                    iVar27 = iVar27 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_03 + lVar10);
                    iVar42 = uVar41 + *piVar1;
                    iVar44 = uVar43 + piVar1[1];
                    iVar47 = uVar46 + piVar1[2];
                    iVar50 = uVar49 + piVar1[3];
                    uVar58 = (uint)(iVar57 < iVar53) * iVar53 | (uint)(iVar57 >= iVar53) * iVar57;
                    uVar60 = (uint)(iVar59 < iVar54) * iVar54 | (uint)(iVar59 >= iVar54) * iVar59;
                    uVar62 = (uint)(iVar61 < iVar55) * iVar55 | (uint)(iVar61 >= iVar55) * iVar61;
                    uVar64 = (uint)(iVar63 < iVar56) * iVar56 | (uint)(iVar63 >= iVar56) * iVar63;
                    uVar35 = (uint)((int)uVar35 < iVar42) * iVar42 |
                             ((int)uVar35 >= iVar42) * uVar35;
                    uVar38 = (uint)((int)uVar38 < iVar44) * iVar44 |
                             ((int)uVar38 >= iVar44) * uVar38;
                    uVar39 = (uint)((int)uVar39 < iVar47) * iVar47 |
                             ((int)uVar39 >= iVar47) * uVar39;
                    uVar40 = (uint)((int)uVar40 < iVar50) * iVar50 |
                             ((int)uVar40 >= iVar50) * uVar40;
                    uVar41 = (iVar34 < (int)uVar58) * uVar58 |
                             (uint)(iVar34 >= (int)uVar58) * iVar34;
                    uVar43 = (iVar20 < (int)uVar60) * uVar60 |
                             (uint)(iVar20 >= (int)uVar60) * iVar20;
                    uVar46 = (iVar12 < (int)uVar62) * uVar62 |
                             (uint)(iVar12 >= (int)uVar62) * iVar12;
                    uVar49 = (iVar27 < (int)uVar64) * uVar64 |
                             (uint)(iVar27 >= (int)uVar64) * iVar27;
                    puVar2 = (uint *)((long)*ptr + lVar10);
                    *puVar2 = uVar58;
                    puVar2[1] = uVar60;
                    puVar2[2] = uVar62;
                    puVar2[3] = uVar64;
                    puVar2 = (uint *)((long)*ptr_01 + lVar10);
                    *puVar2 = uVar41;
                    puVar2[1] = uVar43;
                    puVar2[2] = uVar46;
                    puVar2[3] = uVar49;
                    iVar33 = iVar51;
                    iVar20 = iVar45;
                    iVar12 = iVar48;
                    iVar27 = iVar52;
                  }
                  iVar18 = ptr_00[uVar17 + 1];
                  uVar17 = uVar17 + 1;
                  iVar20 = (int)(*ptr_03)[0] + iVar18;
                  iVar12 = *(int *)((long)*ptr_03 + 4) + uVar41;
                  iVar27 = (int)(*ptr_03)[1] + uVar43;
                  iVar51 = *(int *)((long)*ptr_03 + 0xc) + uVar46;
                  auVar36._0_4_ =
                       (uint)((int)uVar35 < iVar20) * iVar20 | ((int)uVar35 >= iVar20) * uVar35;
                  auVar36._4_4_ =
                       (uint)((int)uVar38 < iVar12) * iVar12 | ((int)uVar38 >= iVar12) * uVar38;
                  auVar36._8_4_ =
                       (uint)((int)uVar39 < iVar27) * iVar27 | ((int)uVar39 >= iVar27) * uVar39;
                  auVar36._12_4_ =
                       (uint)((int)uVar40 < iVar51) * iVar51 | ((int)uVar40 >= iVar51) * uVar40;
                  iVar20 = 2;
                  while( true ) {
                    bVar21 = iVar20 == 0;
                    iVar20 = iVar20 + -1;
                    uVar35 = auVar36._0_4_;
                    uVar38 = auVar36._4_4_;
                    uVar39 = auVar36._8_4_;
                    if (bVar21) break;
                    iVar12 = uVar35 + iVar9;
                    iVar27 = uVar38 + iVar9;
                    iVar51 = uVar39 + iVar9;
                    auVar37._0_4_ =
                         ((int)uVar35 < (int)uVar8) * uVar8 | ((int)uVar35 >= (int)uVar8) * uVar35;
                    auVar37._4_4_ =
                         (uint)((int)uVar38 < iVar12) * iVar12 | ((int)uVar38 >= iVar12) * uVar38;
                    iVar12 = auVar36._12_4_;
                    auVar37._8_4_ =
                         (uint)((int)uVar39 < iVar27) * iVar27 | ((int)uVar39 >= iVar27) * uVar39;
                    auVar37._12_4_ =
                         (uint)(iVar12 < iVar51) * iVar51 | (uint)(iVar12 >= iVar51) * iVar12;
                    auVar36 = auVar37;
                  }
                  uVar49 = (iVar18 < (int)uVar8) * uVar8 | (uint)(iVar18 >= (int)uVar8) * iVar18;
                  uVar41 = ((int)uVar41 < (int)uVar35) * uVar35 |
                           ((int)uVar41 >= (int)uVar35) * uVar41;
                  uVar43 = ((int)uVar43 < (int)uVar38) * uVar38 |
                           ((int)uVar43 >= (int)uVar38) * uVar43;
                  uVar46 = ((int)uVar46 < (int)uVar39) * uVar39 |
                           ((int)uVar46 >= (int)uVar39) * uVar46;
                  uVar40 = uVar8;
                  for (lVar10 = 0; size << 4 != lVar10; lVar10 = lVar10 + 0x10) {
                    iVar51 = uVar40 - gap;
                    iVar45 = uVar35 - gap;
                    iVar48 = uVar38 - gap;
                    iVar52 = uVar39 - gap;
                    iVar18 = uVar49 - open;
                    iVar20 = uVar41 - open;
                    iVar12 = uVar43 - open;
                    iVar27 = uVar46 - open;
                    uVar40 = (uint)(iVar51 < iVar18) * iVar18 | (uint)(iVar51 >= iVar18) * iVar51;
                    uVar35 = (uint)(iVar45 < iVar20) * iVar20 | (uint)(iVar45 >= iVar20) * iVar45;
                    uVar38 = (uint)(iVar48 < iVar12) * iVar12 | (uint)(iVar48 >= iVar12) * iVar48;
                    uVar39 = (uint)(iVar52 < iVar27) * iVar27 | (uint)(iVar52 >= iVar27) * iVar52;
                    piVar1 = (int *)((long)*ptr_01 + lVar10);
                    iVar18 = *piVar1;
                    iVar20 = piVar1[1];
                    iVar12 = piVar1[2];
                    iVar27 = piVar1[3];
                    uVar49 = (iVar18 < (int)uVar40) * uVar40 |
                             (uint)(iVar18 >= (int)uVar40) * iVar18;
                    uVar41 = (iVar20 < (int)uVar35) * uVar35 |
                             (uint)(iVar20 >= (int)uVar35) * iVar20;
                    uVar43 = (iVar12 < (int)uVar38) * uVar38 |
                             (uint)(iVar12 >= (int)uVar38) * iVar12;
                    uVar46 = (iVar27 < (int)uVar39) * uVar39 |
                             (uint)(iVar27 >= (int)uVar39) * iVar27;
                    puVar2 = (uint *)((long)*ptr_02 + lVar10);
                    *puVar2 = uVar49;
                    puVar2[1] = uVar41;
                    puVar2[2] = uVar43;
                    puVar2[3] = uVar46;
                    uVar29 = ((int)uVar49 < (int)uVar29) * uVar49 |
                             ((int)uVar49 >= (int)uVar29) * uVar29;
                    uVar30 = ((int)uVar41 < (int)uVar30) * uVar41 |
                             ((int)uVar41 >= (int)uVar30) * uVar30;
                    uVar31 = ((int)uVar43 < (int)uVar31) * uVar43 |
                             ((int)uVar43 >= (int)uVar31) * uVar31;
                    uVar32 = ((int)uVar46 < (int)uVar32) * uVar46 |
                             ((int)uVar46 >= (int)uVar32) * uVar32;
                    uVar15 = ((int)uVar15 < (int)uVar49) * uVar49 |
                             ((int)uVar15 >= (int)uVar49) * uVar15;
                    uVar25 = ((int)uVar25 < (int)uVar41) * uVar41 |
                             ((int)uVar25 >= (int)uVar41) * uVar25;
                    uVar26 = ((int)uVar26 < (int)uVar43) * uVar43 |
                             ((int)uVar26 >= (int)uVar43) * uVar26;
                    uVar28 = ((int)uVar28 < (int)uVar46) * uVar46 |
                             ((int)uVar28 >= (int)uVar46) * uVar28;
                  }
                }
                alVar23 = ptr_02[(ulong)uVar13 % size];
                iVar18 = 0;
                while( true ) {
                  uVar17 = alVar23[0];
                  lVar10 = alVar23[1];
                  if (3 - (int)(uVar13 / size) <= iVar18) break;
                  alVar23[0] = uVar17 << 0x20;
                  alVar23[1] = lVar10 << 0x20 | uVar17 >> 0x20;
                  iVar18 = iVar18 + 1;
                }
                auVar22._0_4_ = -(uint)((int)uVar29 < (int)uVar8);
                auVar22._4_4_ = -(uint)((int)uVar30 < (int)uVar8);
                auVar22._8_4_ = -(uint)((int)uVar31 < (int)uVar8);
                auVar22._12_4_ = -(uint)((int)uVar32 < (int)uVar8);
                auVar24._0_4_ = -(uint)((int)uVar5 < (int)uVar15);
                auVar24._4_4_ = -(uint)((int)uVar5 < (int)uVar25);
                auVar24._8_4_ = -(uint)((int)uVar5 < (int)uVar26);
                auVar24._12_4_ = -(uint)((int)uVar5 < (int)uVar28);
                iVar18 = movmskps(iVar18,auVar24 | auVar22);
                if (iVar18 == 0) {
                  iVar18 = alVar23[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
                  iVar18 = 0;
                  iVar7 = 0;
                  uVar13 = 0;
                }
                ppVar6->score = iVar18;
                ppVar6->end_query = uVar13;
                ppVar6->end_ref = iVar7;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar6;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar11 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_scan_profile_sse41_128_32",pcVar11);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}